

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

ssize_t Omega_h::gmsh::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  value_type_conflict *pvVar2;
  undefined4 in_register_0000003c;
  shared_ptr<Omega_h::Comm> local_248 [2];
  undefined1 local_228 [8];
  ifstream file;
  CommPtr *comm_local;
  path *filename_local;
  
  pvVar2 = filesystem::path::c_str((path *)__buf);
  std::ifstream::ifstream(local_228,pvVar2,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    pvVar2 = filesystem::path::c_str((path *)__buf);
    fail("couldn\'t open \"%s\"\n",pvVar2);
  }
  std::shared_ptr<Omega_h::Comm>::shared_ptr(local_248,(shared_ptr<Omega_h::Comm> *)__nbytes);
  read(__fd,local_228,(size_t)local_248);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(local_248);
  std::ifstream::~ifstream(local_228);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

Mesh read(filesystem::path const& filename, CommPtr comm) {
  std::ifstream file(filename.c_str());
  if (!file.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", filename.c_str());
  }
  return gmsh::read(file, comm);
}